

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well-founded.cpp
# Opt level: O1

bool __thiscall WellFounded::propagate(WellFounded *this)

{
  uint uVar1;
  int *piVar2;
  bool *pbVar3;
  int *piVar4;
  Lit *pLVar5;
  ConjRule *pCVar6;
  char *pcVar7;
  anon_union_8_2_743a5d44_for_Reason_0 r;
  bool bVar8;
  char cVar9;
  int iVar10;
  vec<int> *pvVar11;
  vec<ConjRule_*> *pvVar12;
  int **ppiVar13;
  uint *puVar14;
  uint uVar15;
  vec<int> *pvVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  bool bVar20;
  int start;
  vec<Lit> ps;
  Clause *c;
  uint local_5c;
  vec<int> *local_58;
  vec<Lit> local_50;
  int **local_40;
  anon_union_8_2_743a5d44_for_Reason_0 local_38;
  
  if ((this->dead_rules).sz != 0) {
    uVar18 = 0;
    do {
      killSupport(this,(this->rules).data[(uint)(this->dead_rules).data[uVar18]]);
      uVar18 = uVar18 + 1;
    } while (uVar18 < (this->dead_rules).sz);
  }
  if ((this->no_support).sz != 0) {
    uVar18 = 0;
    do {
      pvVar11 = (this->no_support).data;
      piVar2 = (this->ushead).data;
      uVar15 = piVar2[uVar18];
      if ((int)uVar15 < (int)pvVar11[uVar18].sz) {
        puVar14 = (uint *)(piVar2 + uVar18);
        do {
          *puVar14 = uVar15 + 1;
          uVar15 = pvVar11[uVar18].data[uVar15];
          pvVar12 = (this->body_occ_rules).data;
          if (pvVar12[uVar15].sz != 0) {
            uVar17 = 0;
            do {
              killSupport(this,pvVar12[uVar15].data[uVar17]);
              uVar17 = uVar17 + 1;
              pvVar12 = (this->body_occ_rules).data;
            } while (uVar17 < pvVar12[uVar15].sz);
          }
          pvVar11 = (this->no_support).data;
          puVar14 = (uint *)((this->ushead).data + uVar18);
          uVar15 = *puVar14;
        } while ((int)uVar15 < (int)pvVar11[uVar18].sz);
      }
      uVar18 = uVar18 + 1;
    } while (uVar18 < (this->no_support).sz);
  }
  local_5c = 0xffffffff;
  if ((this->no_support).sz != 0) {
    piVar2 = (this->pufhead).data;
    pvVar11 = (this->no_support).data;
    pbVar3 = (this->no_support_bool).data;
    uVar18 = 0;
    do {
      pcVar7 = sat.assigns.data;
      uVar15 = piVar2[uVar18];
      uVar1 = local_5c;
      if ((int)uVar15 < (int)pvVar11[uVar18].sz) {
        pvVar16 = pvVar11 + uVar18;
        piVar4 = pvVar16->data;
        pLVar5 = (this->lits).data;
        do {
          uVar1 = piVar4[uVar15];
          if ((pbVar3[uVar1] == true) &&
             (uVar15 = pLVar5[uVar1].x,
             (uVar15 & 1) * 2 + -1 != (int)pcVar7[(uint)((int)uVar15 >> 1)])) break;
          uVar15 = piVar2[uVar18] + 1;
          piVar2[uVar18] = uVar15;
          uVar1 = local_5c;
        } while ((int)uVar15 < (int)pvVar16->sz);
      }
      local_5c = uVar1;
    } while ((local_5c == 0xffffffff) && (uVar18 = uVar18 + 1, uVar18 < (this->no_support).sz));
  }
  if (local_5c == 0xffffffff) {
    bVar8 = true;
    if ((this->no_support).sz != 0) {
      piVar2 = (this->ushead).data;
      piVar4 = (this->pufhead).data;
      ppiVar13 = &((this->no_support).data)->data;
      uVar18 = 0;
      do {
        if (*ppiVar13 != (int *)0x0) {
          ((vec<int> *)(ppiVar13 + -1))->sz = 0;
        }
        piVar2[uVar18] = 0;
        piVar4[uVar18] = 0;
        uVar18 = uVar18 + 1;
        ppiVar13 = ppiVar13 + 2;
      } while (uVar18 < (this->no_support).sz);
    }
  }
  else {
    pvVar11 = &this->ufset;
    if ((this->ufset).data != (int *)0x0) {
      pvVar11->sz = 0;
    }
    vec<int>::push(pvVar11,(int *)&local_5c);
    (this->ufset_bool).data[local_5c] = true;
    if ((this->nfset).data != (int *)0x0) {
      (this->nfset).sz = 0;
    }
    local_58 = pvVar11;
    if (pvVar11->sz != 0) {
      local_40 = &(this->ufset).data;
      uVar18 = 0;
      uVar17 = 0;
      do {
        uVar15 = (this->ufset).data[uVar18];
        if ((this->no_support_bool).data[uVar15] == false) {
          propagate();
        }
        pvVar12 = (this->head_occ_rules).data;
        if (pvVar12[uVar15].sz != 0) {
          uVar19 = 0;
          do {
            pCVar6 = pvVar12[uVar15].data[uVar19];
            uVar1 = (pCVar6->body_lit).x;
            cVar9 = -sat.assigns.data[(uint)((int)uVar1 >> 1)];
            if ((uVar1 & 1) == 0) {
              cVar9 = sat.assigns.data[(uint)((int)uVar1 >> 1)];
            }
            iVar10 = 0x1e;
            if (cVar9 != ::l_False.value) {
              pCVar6->w = pCVar6->sz + -1;
              bVar8 = propRule(this,pCVar6);
              iVar10 = 0;
              if (bVar8) {
                iVar10 = 0x1c;
              }
            }
            if ((iVar10 != 0x1e) && (iVar10 != 0)) break;
            uVar19 = uVar19 + 1;
            pvVar12 = (this->head_occ_rules).data;
          } while (uVar19 < pvVar12[uVar15].sz);
        }
        for (; (int)uVar17 < (int)(this->nfset).sz; uVar17 = (ulong)((int)uVar17 + 1)) {
          pvVar12 = (this->watches).data;
          uVar15 = (this->nfset).data[uVar17];
          if (pvVar12[uVar15].sz != 0) {
            uVar19 = 0;
            do {
              pCVar6 = pvVar12[uVar15].data[uVar19];
              if ((this->no_support_bool).data[(uint)pCVar6->head] == true) {
                uVar1 = (pCVar6->body_lit).x;
                cVar9 = -sat.assigns.data[(uint)((int)uVar1 >> 1)];
                if ((uVar1 & 1) == 0) {
                  cVar9 = sat.assigns.data[(uint)((int)uVar1 >> 1)];
                }
                if (cVar9 != ::l_False.value) {
                  pCVar6->w = pCVar6->w + -1;
                  propRule(this,pCVar6);
                }
              }
              uVar19 = uVar19 + 1;
              pvVar12 = (this->watches).data;
            } while (uVar19 < pvVar12[uVar15].sz);
          }
          if (pvVar12[uVar15].data != (ConjRule **)0x0) {
            pvVar12[uVar15].sz = 0;
          }
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < local_58->sz);
    }
    this->index = 0;
    if ((this->indices).sz != 0) {
      piVar2 = (this->indices).data;
      piVar4 = (this->lowlink).data;
      uVar18 = 0;
      do {
        piVar2[uVar18] = -1;
        piVar4[uVar18] = -1;
        uVar18 = uVar18 + 1;
      } while (uVar18 < (this->indices).sz);
    }
    vec<vec<int>_>::clear(&this->sccs,false);
    pvVar11 = local_58;
    if ((this->ufset).sz != 0) {
      uVar18 = 0;
      do {
        uVar15 = (this->ufset).data[uVar18];
        if (((this->no_support_bool).data[uVar15] == true) && ((this->indices).data[uVar15] == -1))
        {
          strongconnect(this,uVar15,getDynamicEdges);
        }
        uVar18 = uVar18 + 1;
      } while (uVar18 < pvVar11->sz);
    }
    local_50.sz = 1;
    local_50.cap = 1;
    local_50.data = (Lit *)malloc(4);
    (local_50.data)->x = -2;
    if (pvVar11->sz != 0) {
      uVar18 = 0;
      do {
        piVar2 = (this->ufset).data;
        uVar15 = piVar2[uVar18];
        (this->ufset_bool).data[uVar15] = false;
        pvVar12 = (this->watches).data;
        if (pvVar12[uVar15].data != (ConjRule **)0x0) {
          pvVar12[uVar15].sz = 0;
        }
        uVar15 = piVar2[uVar18];
        if ((this->no_support_bool).data[uVar15] == true) {
          pvVar12 = (this->head_occ_rules).data;
          if (pvVar12[uVar15].sz != 0) {
            uVar17 = 0;
            do {
              uVar1 = (pvVar12[uVar15].data[uVar17]->body_lit).x;
              cVar9 = -sat.assigns.data[(uint)((int)uVar1 >> 1)];
              if ((uVar1 & 1) == 0) {
                cVar9 = sat.assigns.data[(uint)((int)uVar1 >> 1)];
              }
              if (cVar9 == ::l_False.value) {
                vec<Lit>::push(&local_50,&pvVar12[uVar15].data[uVar17]->body_lit);
              }
              uVar17 = uVar17 + 1;
              pvVar12 = (this->head_occ_rules).data;
            } while (uVar17 < pvVar12[uVar15].sz);
          }
        }
        uVar18 = uVar18 + 1;
        pvVar11 = local_58;
      } while (uVar18 < local_58->sz);
    }
    uVar15 = local_50.sz;
    local_38._pt = (Clause *)malloc((long)(int)local_50.sz * 4 + 8);
    *(uint *)local_38._pt = (*(uint *)local_38._pt & 0xfc) + uVar15 * 0x100 + 2;
    vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),&local_38._pt);
    r = local_38;
    if (1 < local_50.sz) {
      uVar18 = 1;
      do {
        if (*(uint *)local_38._pt >> 8 <= uVar18) {
          abort();
        }
        (local_38._pt)->data[uVar18].x = local_50.data[uVar18].x;
        uVar18 = uVar18 + 1;
      } while ((uint)uVar18 < local_50.sz);
    }
    bVar8 = pvVar11->sz == 0;
    if (!bVar8) {
      uVar18 = 0;
      do {
        uVar15 = (this->ufset).data[uVar18];
        iVar10 = 0x35;
        if ((this->no_support_bool).data[uVar15] == true) {
          SAT::cEnqueue(&sat,(Lit)((this->lits).data[uVar15].x ^ 1),(Reason)r);
          iVar10 = 1;
          if (sat.confl == (Clause *)0x0) {
            (this->no_support_bool).data[uVar15] = false;
            iVar10 = 0;
          }
        }
        if ((iVar10 != 0x35) && (iVar10 != 0)) goto LAB_001d60f2;
        uVar18 = uVar18 + 1;
        bVar20 = uVar18 < local_58->sz;
        bVar8 = !bVar20;
      } while (bVar20);
    }
    local_38 = (anon_union_8_2_743a5d44_for_Reason_0)this;
    vec<Propagator_*>::push
              (engine.p_queue.data + (uint)(this->super_Propagator).priority,
               (Propagator **)&local_38._pt);
LAB_001d60f2:
    if (local_50.data != (Lit *)0x0) {
      free(local_50.data);
    }
  }
  return bVar8;
}

Assistant:

bool propagate() override {
		// find all unsupported
		if (DEBUG) {
			printf("propagating\n");
		}

		for (unsigned int i = 0; i < dead_rules.size(); i++) {
			killSupport(rules[dead_rules[i]]);
		}

		for (unsigned int i = 0; i < no_support.size(); i++) {
			while (ushead[i] < static_cast<int>(no_support[i].size())) {
				const int x = no_support[i][ushead[i]++];
				for (unsigned int j = 0; j < body_occ_rules[x].size(); j++) {
					killSupport(body_occ_rules[x][j]);
				}
			}
		}

		if (DEBUG) {
			printf("Decision level: %d\n", engine.decisionLevel());
		}

		if (DEBUG) {
			printf("No support: ");
		}
		if (DEBUG) {
			for (unsigned int i = 0; i < no_support.size(); i++) {
				for (unsigned int j = 0; j < no_support[i].size(); j++) {
					printf("%d, ", no_support[i][j]);
				}
			}
		}
		if (DEBUG) {
			printf("\n");
		}

		int start = -1;
		// pick one to start building unfounded set
		for (unsigned int i = 0; i < no_support.size(); i++) {
			for (; pufhead[i] < static_cast<int>(no_support[i].size()); pufhead[i]++) {
				const int x = no_support[i][pufhead[i]];
				if (no_support_bool[x] && !BoolView(lits[x]).isFalse()) {
					start = x;
					break;
				}
			}
			if (start != -1) {
				break;
			}
		}

		// if all processed, we're done
		if (start == -1) {
			if (DEBUG) {
				printf("all done\n");
			}
			for (unsigned int i = 0; i < no_support.size(); i++) {
				no_support[i].clear();
				ushead[i] = 0;
				pufhead[i] = 0;
			}
			return true;
		}

		// start building unfounded set

		ufset.clear();
		ufset.push(start);
		ufset_bool[start] = true;

		if (DEBUG) {
			printf("starting with %d\n", start);
		}

		nfset.clear();
		int nfshead = 0;

		for (unsigned int uf = 0; uf < ufset.size(); uf++) {
			const int h = ufset[uf];
			if (!no_support_bool[h]) {
				fprintf(stderr, "not no_support %d!\n", h);
				for (unsigned int k = 0; k < ufset.size(); k++) {
					fprintf(stderr, "%d ", ufset[k]);
				}
				fprintf(stderr, "- %d %d\n", uf, h);
			}
			assert(no_support_bool[h]);
			// add rules with h as head
			for (unsigned int i = 0; i < head_occ_rules[h].size(); i++) {
				if (DEBUG) {
					printf("checking %dth rule for %d\n", i, h);
				}
				ConjRule* r = head_occ_rules[h][i];
				if (r->isFalse()) {
					continue;
				}
				r->w = r->sz - 1;
				if (DEBUG) {
					printf("proping rule\n");
				}
				if (propRule(*r)) {
					break;
				}
			}

			// propagate nfset

			while (nfshead < static_cast<int>(nfset.size())) {
				const int x = nfset[nfshead++];
				for (unsigned int i = 0; i < watches[x].size(); i++) {
					ConjRule* r = watches[x][i];
					// if head already founded by another rule, ignore
					if (!no_support_bool[r->head]) {
						continue;
					}
					if (r->isFalse()) {
						continue;
					}
					r->w--;
					propRule(*r);
				}
				watches[x].clear();
			}
		}

		// we have now found an unfounded set! i.e., everything in ufset which is still not justified

		// if empty, should jump straight back up!

		// calc dynamic SCC
		//		fprintf(stderr, "calc Dyn SCC\n");

		index = 0;
		assert(S.size() == 0);
		for (unsigned int i = 0; i < indices.size(); i++) {
			indices[i] = -1;
			lowlink[i] = -1;
		}
		sccs.clear();

		for (unsigned int i = 0; i < ufset.size(); i++) {
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			if (indices[h] != -1) {
				continue;
			}
			//			fprintf(stderr, "root %d ", h);
			strongconnect(h, &getDynamicEdges);
		}

		assert(S.size() == 0);

		//		if (sccs.size() > 0) fprintf(stderr, "d %d ", sccs.size());

		// create an explanation

		vec<Lit> ps(1);

		for (unsigned int i = 0; i < ufset.size(); i++) {
			ufset_bool[ufset[i]] = false;
			watches[ufset[i]].clear();
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			for (unsigned int i = 0; i < head_occ_rules[h].size(); i++) {
				ConjRule* r = head_occ_rules[h][i];
				if (r->isFalse()) {
					ps.push(r->body_lit);
				}
			}
		}

		Clause* expl = Reason_new(ps.size());
		for (unsigned int i = 1; i < ps.size(); i++) {
			(*expl)[i] = ps[i];
		}
		for (unsigned int i = 0; i < ufset.size(); i++) {
			const int h = ufset[i];
			if (!no_support_bool[h]) {
				continue;
			}
			if (DEBUG) {
				printf("making %d false\n", h);
			}
			if (ADD_CLAUSES) {
				ps[0] = ~lits[h];
				sat.addClause(*Clause_new(ps, false), false);
			}
			assert(!BoolView(lits[h]).isFalse());
			if (!BoolView(lits[h]).setVal(false, expl)) {
				return false;
			}
			no_support_bool[h] = false;
		}

		if (DEBUG) {
			printf("reawaken\n");
		}

		// reawaken, this is not quite correct
		engine.p_queue[priority].push(this);

		return true;
	}